

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

void cancel_method_proc(Am_Object param_1)

{
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Value AVar1;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,&pop_up_window);
  Am_Value::Am_Value(&local_18,(Am_Value *)&Am_No_Value);
  AVar1.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar1._0_8_ = &local_18;
  Am_Finish_Pop_Up_Waiting((Am_Object_Data *)&local_20,AVar1);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, cancel_method,
		 (Am_Object /* cmd */)) {
  Am_Finish_Pop_Up_Waiting(pop_up_window, Am_No_Value);
}